

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*>::tryEmplace_impl<QByteArray_const&>
          (TryEmplaceResult *__return_storage_ptr__,
          QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*> *this,QByteArray *key)

{
  uchar uVar1;
  Span *pSVar2;
  size_t hash;
  Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *pDVar3;
  Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *n;
  long in_FS_OFFSET;
  bool bVar4;
  Bucket BVar5;
  Bucket local_50;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)this;
  if (pDVar3 == (Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *)0x0)
  {
    QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::detach
              ((QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)this);
    pDVar3 = *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)this;
  }
  local_40.d = (Data *)0x0;
  hash = ::qHash(key,pDVar3->seed);
  BVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
          ::findBucketWithHash<QByteArray>(pDVar3,key,hash);
  uVar1 = (BVar5.span)->offsets[BVar5.index];
  pDVar3 = *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)this;
  local_50 = BVar5;
  if ((pDVar3 == (Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *)0x0
      ) || (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_00281516:
    QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::operator=
              (&local_40,(QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)this);
    pDVar3 = *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)this;
    if (uVar1 == 0xff) {
      bVar4 = pDVar3->numBuckets >> 1 <= pDVar3->size;
    }
    else {
      bVar4 = false;
    }
    pSVar2 = pDVar3->spans;
    if (bVar4) {
      pDVar3 = QHashPrivate::
               Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
               detached(pDVar3,pDVar3->size + 1);
      *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)this =
           pDVar3;
      local_50 = QHashPrivate::
                 Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
                 findBucketWithHash<QByteArray>(pDVar3,key,hash);
    }
    else {
      pDVar3 = QHashPrivate::
               Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
               detached(pDVar3);
      *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)this =
           pDVar3;
      local_50.index._0_4_ = (uint)BVar5.index & 0x7f;
      local_50.span =
           pDVar3->spans + ((((long)BVar5.span - (long)pSVar2) / 0x90 << 7 | BVar5.index) >> 7);
      local_50.index._4_4_ = 0;
    }
    if (uVar1 != 0xff) {
      pDVar3 = *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)
                this;
      goto LAB_002815dd;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_002815dd;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) goto LAB_00281516;
  }
  n = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
      Bucket::insert(&local_50);
  QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::createInPlace<>(n,key);
  pDVar3 = *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)this;
  pDVar3->size = pDVar3->size + 1;
LAB_002815dd:
  pSVar2 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)local_50.span - (long)pSVar2) / 0x90 << 7 | local_50.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }